

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMockerBase<void_(int,_int,_mp::ComplInfo)>::PerformDefaultAction
          (FunctionMockerBase<void_(int,_int,_mp::ComplInfo)> *this,ArgumentTuple *args,
          string *call_description)

{
  bool bVar1;
  OnCallSpec<void_(int,_int,_mp::ComplInfo)> *pOVar2;
  runtime_error *this_00;
  OnCallSpec<void_(int,_int,_mp::ComplInfo)> *in_RSI;
  ArgumentTuple *in_RDI;
  Action<void_(int,_int,_mp::ComplInfo)> *unaff_retaddr;
  string message;
  OnCallSpec<void_(int,_int,_mp::ComplInfo)> *spec;
  ArgumentTuple *in_stack_ffffffffffffffc0;
  FunctionMockerBase<void_(int,_int,_mp::ComplInfo)> *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  pOVar2 = FindOnCallSpec(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pOVar2 == (OnCallSpec<void_(int,_int,_mp::ComplInfo)> *)0x0) {
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    bVar1 = DefaultValue<void>::Exists();
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffc0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    DefaultValue<void>::Get();
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  else {
    OnCallSpec<void_(int,_int,_mp::ComplInfo)>::GetAction(in_RSI);
    Action<void_(int,_int,_mp::ComplInfo)>::Perform(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }